

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O1

bool __thiscall LineReader::ReadLine(LineReader *this,char **line_start,char **line_end)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  if ((this->line_start_ < this->buf_end_) && (this->line_end_ != (char *)0x0)) {
    this->line_start_ = this->line_end_ + 1;
  }
  else {
    pcVar4 = this->buf_;
    sVar3 = fread(pcVar4,1,0x40000,(FILE *)this->file_);
    if (sVar3 == 0) {
      return false;
    }
    this->line_start_ = pcVar4;
    this->buf_end_ = pcVar4 + sVar3;
  }
  pcVar4 = this->buf_end_;
  __s = this->line_start_;
  sVar3 = (long)pcVar4 - (long)__s;
  pcVar1 = (char *)memchr(__s,10,sVar3);
  this->line_end_ = pcVar1;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = this->buf_;
    memmove(pcVar1,__s,sVar3);
    pcVar4 = pcVar4 + ((long)pcVar1 - (long)__s);
    sVar2 = fread(pcVar4,1,0x40000 - sVar3,(FILE *)this->file_);
    this->buf_end_ = pcVar4 + sVar2;
    this->line_start_ = pcVar1;
    pcVar4 = (char *)memchr(pcVar1,10,sVar3 + sVar2);
    this->line_end_ = pcVar4;
  }
  *line_start = this->line_start_;
  *line_end = this->line_end_;
  return true;
}

Assistant:

bool ReadLine(char** line_start, char** line_end) {
    if (line_start_ >= buf_end_ || !line_end_) {
      // Buffer empty, refill.
      size_t size_read = fread(buf_, 1, sizeof(buf_), file_);
      if (!size_read)
        return false;
      line_start_ = buf_;
      buf_end_ = buf_ + size_read;
    } else {
      // Advance to next line in buffer.
      line_start_ = line_end_ + 1;
    }

    line_end_ = (char*)memchr(line_start_, '\n', buf_end_ - line_start_);
    if (!line_end_) {
      // No newline. Move rest of data to start of buffer, fill rest.
      size_t already_consumed = line_start_ - buf_;
      size_t size_rest = (buf_end_ - buf_) - already_consumed;
      memmove(buf_, line_start_, size_rest);

      size_t read = fread(buf_ + size_rest, 1, sizeof(buf_) - size_rest, file_);
      buf_end_ = buf_ + size_rest + read;
      line_start_ = buf_;
      line_end_ = (char*)memchr(line_start_, '\n', buf_end_ - line_start_);
    }

    *line_start = line_start_;
    *line_end = line_end_;
    return true;
  }